

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O3

TaskInfo * __thiscall
anon_unknown.dwarf_1939c1::BuildEngineImpl::getTaskInfo(BuildEngineImpl *this,Task *task)

{
  ulong uVar1;
  __node_base_ptr p_Var2;
  int iVar3;
  ulong uVar4;
  _Hash_node_base *p_Var5;
  __hash_code __code;
  TaskInfo *pTVar6;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->taskInfosMutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  uVar1 = (this->taskInfos)._M_h._M_bucket_count;
  pTVar6 = (TaskInfo *)0x0;
  uVar4 = (ulong)task % uVar1;
  p_Var2 = (this->taskInfos)._M_h._M_buckets[uVar4];
  if (p_Var2 != (__node_base_ptr)0x0) {
    p_Var5 = p_Var2->_M_nxt;
    if (p_Var5[1]._M_nxt != (_Hash_node_base *)task) {
      pTVar6 = (TaskInfo *)0x0;
      do {
        p_Var5 = p_Var5->_M_nxt;
        if ((p_Var5 == (_Hash_node_base *)0x0) || ((ulong)p_Var5[1]._M_nxt % uVar1 != uVar4))
        goto LAB_00142844;
      } while (p_Var5[1]._M_nxt != (_Hash_node_base *)task);
    }
    pTVar6 = (TaskInfo *)(p_Var5 + 2);
  }
LAB_00142844:
  pthread_mutex_unlock((pthread_mutex_t *)&this->taskInfosMutex);
  return pTVar6;
}

Assistant:

TaskInfo* getTaskInfo(Task* task) {
    std::lock_guard<std::mutex> guard(taskInfosMutex);
    auto it = taskInfos.find(task);
    return it == taskInfos.end() ? nullptr : &it->second;
  }